

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walMerge(u32 *aContent,ht_slot *aLeft,int nLeft,ht_slot **paRight,int *pnRight,ht_slot *aTmp)

{
  int iVar1;
  u32 uVar2;
  ht_slot *phVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ht_slot *phVar11;
  
  iVar1 = *pnRight;
  bVar4 = 0 < iVar1;
  bVar5 = 0 < nLeft;
  lVar6 = 0;
  if (bVar4 || bVar5) {
    phVar3 = *paRight;
    lVar6 = 0;
    iVar10 = 0;
    iVar7 = 0;
    do {
      if ((!bVar5) || ((bVar4 && (aContent[phVar3[iVar7]] <= aContent[aLeft[iVar10]])))) {
        iVar8 = iVar7 + 1;
        phVar11 = phVar3;
        iVar9 = iVar10;
        iVar10 = iVar7;
      }
      else {
        phVar11 = aLeft;
        iVar9 = iVar10 + 1;
        iVar8 = iVar7;
      }
      uVar2 = aContent[phVar11[iVar10]];
      aTmp[lVar6] = phVar11[iVar10];
      if (iVar9 < nLeft) {
        iVar9 = (uint)(aContent[aLeft[iVar9]] == uVar2) + iVar9;
      }
      bVar5 = iVar9 < nLeft;
      lVar6 = lVar6 + 1;
      bVar4 = iVar8 < iVar1;
      iVar10 = iVar9;
      iVar7 = iVar8;
    } while ((iVar8 < iVar1) || (iVar9 < nLeft));
  }
  *paRight = aLeft;
  *pnRight = (int)lVar6;
  memcpy(aLeft,aTmp,(ulong)(uint)((int)lVar6 * 2));
  return;
}

Assistant:

static void walMerge(
  const u32 *aContent,            /* Pages in wal - keys for the sort */
  ht_slot *aLeft,                 /* IN: Left hand input list */
  int nLeft,                      /* IN: Elements in array *paLeft */
  ht_slot **paRight,              /* IN/OUT: Right hand input list */
  int *pnRight,                   /* IN/OUT: Elements in *paRight */
  ht_slot *aTmp                   /* Temporary buffer */
){
  int iLeft = 0;                  /* Current index in aLeft */
  int iRight = 0;                 /* Current index in aRight */
  int iOut = 0;                   /* Current index in output buffer */
  int nRight = *pnRight;
  ht_slot *aRight = *paRight;

  assert( nLeft>0 && nRight>0 );
  while( iRight<nRight || iLeft<nLeft ){
    ht_slot logpage;
    Pgno dbpage;

    if( (iLeft<nLeft) 
     && (iRight>=nRight || aContent[aLeft[iLeft]]<aContent[aRight[iRight]])
    ){
      logpage = aLeft[iLeft++];
    }else{
      logpage = aRight[iRight++];
    }
    dbpage = aContent[logpage];

    aTmp[iOut++] = logpage;
    if( iLeft<nLeft && aContent[aLeft[iLeft]]==dbpage ) iLeft++;

    assert( iLeft>=nLeft || aContent[aLeft[iLeft]]>dbpage );
    assert( iRight>=nRight || aContent[aRight[iRight]]>dbpage );
  }

  *paRight = aLeft;
  *pnRight = iOut;
  memcpy(aLeft, aTmp, sizeof(aTmp[0])*iOut);
}